

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> __thiscall
wabt::
MakeUnique<wabt::WastLexer,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>,wabt::string_view&>
          (wabt *this,unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *args,
          string_view *args_1)

{
  WastLexer *this_00;
  _Head_base<0UL,_wabt::LexerSource_*,_false> local_28;
  
  this_00 = (WastLexer *)operator_new(0x58);
  local_28._M_head_impl =
       (args->_M_t).
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  (args->_M_t).super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl = (LexerSource *)0x0;
  WastLexer::WastLexer
            (this_00,(unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)
                     &local_28,*args_1);
  *(WastLexer **)this = this_00;
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr
            ((unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)&local_28);
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}